

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_mode_search.c
# Opt level: O2

void av1_search_palette_mode_luma
               (AV1_COMP *cpi,MACROBLOCK *x,BLOCK_SIZE bsize,uint ref_frame_cost,
               PICK_MODE_CONTEXT *ctx,RD_STATS *this_rd_cost,int64_t best_rd)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  MB_MODE_INFO *__src;
  PALETTE_BUFFER *best_palette_color_map;
  uint8_t *__dest;
  int (*paiVar5) [2];
  uint8_t uVar6;
  uint uVar7;
  undefined7 in_register_00000011;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  int64_t best_rd_palette;
  uint local_910 [2];
  int64_t local_908 [3];
  uint8_t local_8f0 [8];
  MB_MODE_INFO best_mbmi_palette;
  uint8_t best_tx_type_map [1024];
  uint8_t best_blk_skip [1024];
  
  uVar10 = CONCAT71(in_register_00000011,bsize) & 0xffffffff;
  __src = *(x->e_mbd).mi;
  best_rd_palette = best_rd;
  best_palette_color_map = x->palette_buffer;
  __dest = (x->e_mbd).plane[0].color_index_map;
  memcpy(&best_mbmi_palette,__src,0xb0);
  bVar1 = ""[uVar10];
  bVar2 = block_size_high[uVar10];
  bVar3 = block_size_wide[uVar10];
  __src->mode = '\0';
  __src->uv_mode = '\0';
  __src->ref_frame[0] = '\0';
  __src->ref_frame[1] = -1;
  (__src->palette_mode_info).palette_size[0] = '\0';
  (__src->palette_mode_info).palette_size[1] = '\0';
  local_910[0] = 0x7fffffff;
  local_910[1] = 0;
  local_908[0] = 0x7fffffffffffffff;
  local_908[1] = 0x7fffffffffffffff;
  local_908[2] = 0x7fffffffffffffff;
  local_8f0[0] = '\0';
  av1_rd_pick_palette_intra_sby
            (cpi,x,bsize,(x->mode_costs).mbmode_cost[bVar1][0],&best_mbmi_palette,
             best_palette_color_map->best_palette_color_map,&best_rd_palette,(int *)local_910,
             (int *)0x0,local_908,local_8f0,(int *)0x0,ctx,best_blk_skip,best_tx_type_map);
  if ((local_910[0] == 0x7fffffff) || ((__src->palette_mode_info).palette_size[0] == '\0')) {
    this_rd_cost->rdcost = 0x7fffffffffffffff;
  }
  else {
    memcpy((x->txfm_search_info).blk_skip,best_blk_skip,
           (long)(1 << ("\x04\x05\x05\x06\a\a\b\t\t\n\v\v\f\r\r\x0e\x06\x06\b\b\n\n"[uVar10] - 4 &
                       0x1f)));
    memcpy((x->e_mbd).tx_type_map,best_tx_type_map,(long)ctx->num_4x4_blk);
    memcpy(__dest,best_palette_color_map,(ulong)bVar3 * (ulong)bVar2);
    uVar6 = local_8f0[0];
    uVar8 = local_910[0] + ref_frame_cost;
    local_910[0] = uVar8;
    uVar7 = av1_get_skip_txfm_context(&x->e_mbd);
    paiVar5 = (x->mode_costs).skip_txfm_cost + uVar7;
    if (uVar6 != '\0') {
      uVar8 = ref_frame_cost;
      paiVar5 = (int (*) [2])((x->mode_costs).skip_txfm_cost[uVar7] + 1);
    }
    iVar9 = uVar8 + (*paiVar5)[0];
    iVar4 = x->rdmult;
    this_rd_cost->rate = iVar9;
    this_rd_cost->dist = local_908[0];
    this_rd_cost->rdcost = local_908[0] * 0x80 + ((long)iVar4 * (long)iVar9 + 0x100 >> 9);
    this_rd_cost->skip_txfm = uVar6;
  }
  return;
}

Assistant:

void av1_search_palette_mode_luma(const AV1_COMP *cpi, MACROBLOCK *x,
                                  BLOCK_SIZE bsize, unsigned int ref_frame_cost,
                                  PICK_MODE_CONTEXT *ctx,
                                  RD_STATS *this_rd_cost, int64_t best_rd) {
  MB_MODE_INFO *const mbmi = x->e_mbd.mi[0];
  PALETTE_MODE_INFO *const pmi = &mbmi->palette_mode_info;
  MACROBLOCKD *const xd = &x->e_mbd;
  int64_t best_rd_palette = best_rd, this_rd;
  uint8_t *const best_palette_color_map =
      x->palette_buffer->best_palette_color_map;
  uint8_t *const color_map = xd->plane[0].color_index_map;
  MB_MODE_INFO best_mbmi_palette = *mbmi;
  uint8_t best_blk_skip[MAX_MIB_SIZE * MAX_MIB_SIZE];
  uint8_t best_tx_type_map[MAX_MIB_SIZE * MAX_MIB_SIZE];
  const ModeCosts *mode_costs = &x->mode_costs;
  const int *const intra_mode_cost =
      mode_costs->mbmode_cost[size_group_lookup[bsize]];
  const int rows = block_size_high[bsize];
  const int cols = block_size_wide[bsize];

  mbmi->mode = DC_PRED;
  mbmi->uv_mode = UV_DC_PRED;
  mbmi->ref_frame[0] = INTRA_FRAME;
  mbmi->ref_frame[1] = NONE_FRAME;
  av1_zero(pmi->palette_size);

  RD_STATS rd_stats_y;
  av1_invalid_rd_stats(&rd_stats_y);
  av1_rd_pick_palette_intra_sby(cpi, x, bsize, intra_mode_cost[DC_PRED],
                                &best_mbmi_palette, best_palette_color_map,
                                &best_rd_palette, &rd_stats_y.rate, NULL,
                                &rd_stats_y.dist, &rd_stats_y.skip_txfm, NULL,
                                ctx, best_blk_skip, best_tx_type_map);
  if (rd_stats_y.rate == INT_MAX || pmi->palette_size[0] == 0) {
    this_rd_cost->rdcost = INT64_MAX;
    return;
  }

  memcpy(x->txfm_search_info.blk_skip, best_blk_skip,
         sizeof(best_blk_skip[0]) * bsize_to_num_blk(bsize));
  av1_copy_array(xd->tx_type_map, best_tx_type_map, ctx->num_4x4_blk);
  memcpy(color_map, best_palette_color_map,
         rows * cols * sizeof(best_palette_color_map[0]));

  rd_stats_y.rate += ref_frame_cost;

  if (rd_stats_y.skip_txfm) {
    rd_stats_y.rate =
        ref_frame_cost +
        mode_costs->skip_txfm_cost[av1_get_skip_txfm_context(xd)][1];
  } else {
    rd_stats_y.rate +=
        mode_costs->skip_txfm_cost[av1_get_skip_txfm_context(xd)][0];
  }
  this_rd = RDCOST(x->rdmult, rd_stats_y.rate, rd_stats_y.dist);
  this_rd_cost->rate = rd_stats_y.rate;
  this_rd_cost->dist = rd_stats_y.dist;
  this_rd_cost->rdcost = this_rd;
  this_rd_cost->skip_txfm = rd_stats_y.skip_txfm;
}